

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerfHint.cpp
# Opt level: O2

void WritePerfHint(PerfHints hint,FunctionBody *functionBody,uint byteCodeOffset)

{
  PerfHintLevels PVar1;
  LPCWSTR pWVar2;
  LPCWSTR pWVar3;
  LPCWSTR pWVar4;
  code *pcVar5;
  int iVar6;
  bool bVar7;
  undefined4 *puVar8;
  LPCWSTR pchUrl;
  char16 *pcVar9;
  WCHAR local_258 [4];
  TCHAR shortName [255];
  ULONG local_38;
  ULONG local_34;
  ULONG lineNumber;
  LONG columnNumber;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x10,"(functionBody)","functionBody");
    if (!bVar7) goto LAB_006e71b7;
    *puVar8 = 0;
  }
  if (PolymorphicInilineCap < hint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x11,"(((uint)hint) < (sizeof(*__countof_helper(s_perfHintContainer)) + 0))"
                       ,"((uint)hint) < _countof(s_perfHintContainer)");
    if (!bVar7) goto LAB_006e71b7;
    *puVar8 = 0;
  }
  iVar6 = DAT_0145c378;
  pWVar2 = s_perfHintContainer[hint].description;
  pWVar3 = s_perfHintContainer[hint].consequences;
  pWVar4 = s_perfHintContainer[hint].suggestion;
  PVar1 = s_perfHintContainer[hint].level;
  if (2 < DAT_0145c378) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x16,"(level <= (int)PerfHintLevels::VERBOSE)",
                       "level <= (int)PerfHintLevels::VERBOSE");
    if (!bVar7) {
LAB_006e71b7:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  if ((int)PVar1 <= iVar6) {
    local_38 = Js::ParseableFunctionInfo::GetLineNumber(&functionBody->super_ParseableFunctionInfo);
    local_34 = Js::ParseableFunctionInfo::GetColumnNumber
                         (&functionBody->super_ParseableFunctionInfo);
    if (byteCodeOffset != 0xffffffff) {
      Js::FunctionBody::GetLineCharOffset
                (functionBody,byteCodeOffset,&local_38,(LONG *)&local_34,false);
      local_38 = local_38 + 1;
      local_34 = local_34 + 1;
    }
    pchUrl = Js::ParseableFunctionInfo::GetSourceName(&functionBody->super_ParseableFunctionInfo);
    Js::FunctionBody::GetShortNameFromUrl(pchUrl,local_258,0xff);
    pcVar9 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&functionBody->super_ParseableFunctionInfo);
    Output::Trace(PerfHintPhase,
                  L"%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"
                  ,L"Not optimized",pWVar2,pcVar9,local_258,(ulong)local_38,(ulong)local_34,pWVar3,
                  pWVar4);
    Output::Flush();
  }
  return;
}

Assistant:

void WritePerfHint(PerfHints hint, Js::FunctionBody * functionBody, uint byteCodeOffset /*= Js::Constants::NoByteCodeOffset*/)
{
    Assert(functionBody);
    Assert(((uint)hint) < _countof(s_perfHintContainer));

    PerfHintItem item = s_perfHintContainer[(uint)hint];

    int level = CONFIG_FLAG(PerfHintLevel);
    Assert(level <= (int)PerfHintLevels::VERBOSE);

    if ((int)item.level <= level)
    {
        ULONG lineNumber = functionBody->GetLineNumber();
        LONG columnNumber = functionBody->GetColumnNumber();
        if (byteCodeOffset != Js::Constants::NoByteCodeOffset)
        {
            functionBody->GetLineCharOffset(byteCodeOffset, &lineNumber, &columnNumber, false /*canAllocateLineCache*/);

            // returned values are 0-based. Adjusting.
            lineNumber++;
            columnNumber++;
        }

        // We will print the short name.
        TCHAR shortName[255];
        Js::FunctionBody::GetShortNameFromUrl(functionBody->GetSourceName(), shortName, 255);

        OUTPUT_TRACE(Js::PerfHintPhase, _u("%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"),
            item.isNotOptimized ? _u("Not optimized") : _u("Optimized"),
            item.description,
            functionBody->GetExternalDisplayName(),
            shortName,
            lineNumber,
            columnNumber,
            item.consequences,
            item.suggestion);
        Output::Flush();
    }
}